

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O2

QSize __thiscall QtMWidgets::DateTimePicker::sizeHint(DateTimePicker *this)

{
  int iVar1;
  int extraout_var;
  reference pSVar2;
  QSize QVar3;
  int extraout_var_00;
  DateTimePickerPrivate *pDVar4;
  int iVar5;
  long lVar6;
  int i;
  long i_00;
  QLatin1String latin1;
  QArrayDataPointer<char16_t> QStack_88;
  QStyleOption opt;
  QString local_50;
  
  QStyleOption::QStyleOption(&opt,1,0);
  QStyleOption::initFrom((QWidget *)&opt);
  latin1.m_data = "AM";
  latin1.m_size = 2;
  QString::QString((QString *)&QStack_88,latin1);
  QFontMetrics::boundingRect(&local_50);
  ((this->d).d)->itemHeight = (extraout_var_00 - extraout_var) + 1;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_88);
  pDVar4 = (this->d).d;
  iVar5 = pDVar4->itemHeight;
  pDVar4->itemTopMargin = iVar5 / 3;
  iVar1 = (iVar5 / 3) * (pDVar4->itemsMaxCount + -1) + pDVar4->itemsMaxCount * iVar5;
  pDVar4->widgetHeight = iVar1;
  pDVar4->currentItemY = iVar5 / -2 + iVar1 / 2;
  lVar6 = 0;
  iVar5 = 0;
  for (i_00 = 0; i_00 < (pDVar4->super_DateTimeParser).sections.d.size; i_00 = i_00 + 1) {
    iVar1 = Section::maxWidth((Section *)
                              ((long)&((pDVar4->super_DateTimeParser).sections.d.ptr)->type + lVar6)
                              ,&opt);
    pSVar2 = QList<QtMWidgets::Section>::operator[]
                       (&(((this->d).d)->super_DateTimeParser).sections,i_00);
    pSVar2->sectionWidth = iVar1;
    pDVar4 = (this->d).d;
    iVar1 = pDVar4->itemSideMargin;
    pSVar2 = QList<QtMWidgets::Section>::operator[](&(pDVar4->super_DateTimeParser).sections,i_00);
    pSVar2->sectionWidth = pSVar2->sectionWidth + iVar1 * 2 + 6;
    pSVar2 = QList<QtMWidgets::Section>::operator[]
                       (&(((this->d).d)->super_DateTimeParser).sections,i_00);
    iVar5 = iVar5 + pSVar2->sectionWidth;
    pDVar4 = (this->d).d;
    lVar6 = lVar6 + 0x30;
  }
  iVar1 = pDVar4->widgetHeight;
  QStyleOption::~QStyleOption(&opt);
  QVar3.ht = iVar1;
  QVar3.wd = iVar5;
  return QVar3;
}

Assistant:

QSize
DateTimePicker::sizeHint() const
{
	QStyleOption opt;
	opt.initFrom( this );

	d->itemHeight = opt.fontMetrics.boundingRect( QLatin1String( "AM" ) )
		.height();

	d->itemTopMargin = d->itemHeight / 3;

	d->widgetHeight = d->itemHeight * d->itemsMaxCount +
		( d->itemsMaxCount - 1 ) * d->itemTopMargin;

	d->currentItemY = d->widgetHeight / 2 - d->itemHeight / 2;

	int widgetWidth = 0;

	for( int i = 0; i < d->sections.size(); ++i )
	{
		d->sections[ i ].sectionWidth = d->sections.at( i ).maxWidth( opt );
		d->sections[ i ].sectionWidth += d->itemSideMargin * 2 + 6;
		widgetWidth += d->sections[ i ].sectionWidth;
	}

	return QSize( widgetWidth, d->widgetHeight );
}